

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGather2DCase::generateIterations
          (TextureGather2DCase *this)

{
  GatherType gatherType;
  undefined1 local_30 [32];
  undefined1 local_10 [8];
  TextureGather2DCase *this_local;
  
  gatherType = (this->super_TextureGatherCase).m_gatherType;
  local_10 = (undefined1  [8])this;
  TextureGatherCase::getOffsetRange((TextureGatherCase *)local_30);
  generateBasic2DCaseIterations
            ((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
              *)(local_30 + 8),gatherType,&(this->super_TextureGatherCase).m_textureFormat,
             (IVec2 *)local_30);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ::operator=(&this->m_iterations,
              (vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
               *)(local_30 + 8));
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
  ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GatherArgs>_>
             *)(local_30 + 8));
  return;
}

Assistant:

void TextureGather2DCase::generateIterations (void)
{
	DE_ASSERT(m_iterations.empty());
	m_iterations = generateBasic2DCaseIterations(m_gatherType, m_textureFormat, getOffsetRange());
}